

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O2

bool IRT::isCJumpBasicBlock(CStatementList *basicBlock)

{
  CStatement *pCVar1;
  uint __line;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar2;
  long lVar3;
  char *__assertion;
  bool bVar4;
  
  if (basicBlock == (CStatementList *)0x0) {
    __assertion = "basicBlock != nullptr";
    __line = 0x1c;
  }
  else {
    pvVar2 = CStatementList::Statements(basicBlock);
    if ((pvVar2->
        super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (pvVar2->
        super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      pvVar2 = CStatementList::Statements(basicBlock);
      pCVar1 = (pvVar2->
               super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      if (pCVar1 == (CStatement *)0x0) {
        bVar4 = false;
      }
      else {
        lVar3 = __dynamic_cast(pCVar1,&CStatement::typeinfo,&CJumpConditionalStatement::typeinfo,0);
        bVar4 = lVar3 != 0;
      }
      return bVar4;
    }
    __assertion = "basicBlock->Statements().size() != 0";
    __line = 0x1d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,__line,"bool IRT::isCJumpBasicBlock(const CStatementList *)");
}

Assistant:

bool isCJumpBasicBlock(const CStatementList* basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* lastStm = basicBlock->Statements().back().get();

        return dynamic_cast<const CJumpConditionalStatement*>(lastStm) != nullptr;
    }